

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_update_decoder.cpp
# Opt level: O1

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
* __thiscall
bidfx_public_api::price::pixie::PriceUpdateDecoder::DecodePriceUpdate_abi_cxx11_
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
           *__return_storage_ptr__,PriceUpdateDecoder *this,ByteBuffer *buffer,
          IDataDictionary *data_dictionary)

{
  _Rb_tree_header *p_Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
  *price_map;
  ByteBuffer *buffer_00;
  FieldDef field_def;
  undefined1 local_70 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  PriceField local_40;
  
  buffer_00 = (ByteBuffer *)this;
  uVar2 = tools::Varint::ReadU32((InputStream *)this);
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  price_map = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bidfx_public_api::price::PriceField>_>_>
               *)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  if (uVar2 != 0) {
    do {
      uVar3 = tools::Varint::ReadU32((InputStream *)this);
      if (uVar3 == 0x7fffffff) {
        uVar3 = tools::Varint::ReadU32((InputStream *)this);
        GetFieldDef((FieldDef *)local_70,buffer_00,(IDataDictionary *)buffer,price_map,uVar3);
        buffer_00 = (ByteBuffer *)(local_70 + 8);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>,std::_Select1st<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
        ::_M_emplace_unique<std::__cxx11::string&,bidfx_public_api::price::PriceField&>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>,std::_Select1st<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
                    *)__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer_00,
                   (PriceField *)PriceField::null);
      }
      else {
        GetFieldDef((FieldDef *)local_70,buffer_00,(IDataDictionary *)buffer,price_map,uVar3);
        DecodeField((PriceUpdateDecoder *)&local_40,(ByteBuffer *)this,(FieldDef *)local_70);
        buffer_00 = (ByteBuffer *)(local_70 + 8);
        std::
        _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>,std::_Select1st<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
        ::_M_emplace_unique<std::__cxx11::string&,bidfx_public_api::price::PriceField>
                  ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>,std::_Select1st<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,bidfx_public_api::price::PriceField>>>
                    *)__return_storage_ptr__,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)buffer_00,
                   &local_40);
        PriceField::~PriceField(&local_40);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._8_8_ != &local_58) {
        buffer_00 = (ByteBuffer *)(local_58._M_allocated_capacity + 1);
        operator_delete((void *)local_70._8_8_,(ulong)buffer_00);
      }
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  return __return_storage_ptr__;
}

Assistant:

std::map<std::string, PriceField> PriceUpdateDecoder::DecodePriceUpdate(ByteBuffer& buffer, IDataDictionary& data_dictionary)
{
    uint32_t size = Varint::ReadU32(buffer);
    std::map<std::string, PriceField> price_map;
    for (uint32_t i = 0; i < size; i++)
    {
        uint32_t fid = Varint::ReadU32(buffer);
        if (fid == FieldDef::REFERENCING_FID)
        {
            uint32_t referenced_fid = Varint::ReadU32(buffer);
            FieldDef field_def = GetFieldDef(buffer, data_dictionary, price_map, referenced_fid);
            price_map.emplace(field_def.name_, PriceField::null);
        }
        else
        {
            FieldDef field_def = GetFieldDef(buffer, data_dictionary, price_map, fid);
            price_map.emplace(field_def.name_, DecodeField(buffer, field_def));
        }
    }
    return price_map;
}